

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::WriteTargetRebuildManifest(cmGlobalNinjaGenerator *this,ostream *os)

{
  cmOutputConverter *this_00;
  cmLocalGenerator *this_01;
  cmGeneratedFileStream *pcVar1;
  pointer ppcVar2;
  string *psVar3;
  cmake *pcVar4;
  bool bVar5;
  byte bVar6;
  string *psVar7;
  ostream *poVar8;
  string *__x;
  mapped_type *pmVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  string *fi;
  pointer ppcVar10;
  allocator<char> local_52e;
  allocator<char> local_52d;
  allocator<char> local_52c;
  allocator<char> local_52b;
  allocator<char> local_52a;
  allocator<char> local_529;
  string ninjaBuildFile;
  string verifyForce;
  cmNinjaDeps missingInputs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  undefined8 local_498;
  string local_488;
  string local_468;
  ostream *local_440;
  cmNinjaDeps implicitDeps;
  cmNinjaDeps verifyForceDeps;
  string local_3f8;
  cmNinjaVars variables;
  cmNinjaDeps local_3a8;
  cmNinjaDeps local_388;
  cmNinjaDeps explicitDeps;
  string local_348;
  ostringstream verify_cmd;
  size_type sStack_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  size_type *local_308;
  undefined8 local_300;
  ostringstream cmd;
  
  local_440 = os;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmd,"CMAKE_SUPPRESS_REGENERATION",(allocator<char> *)&verify_cmd);
  bVar5 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,(string *)&cmd);
  std::__cxx11::string::~string((string *)&cmd);
  if (bVar5) {
    return;
  }
  this_01 = *(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmd);
  psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  this_00 = &this_01->super_cmOutputConverter;
  cmOutputConverter::ConvertToOutputFormat((string *)&verify_cmd,this_00,psVar7,SHELL);
  poVar8 = std::operator<<((ostream *)&cmd,(string *)&verify_cmd);
  poVar8 = std::operator<<(poVar8," -S");
  psVar7 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(this_01);
  cmOutputConverter::ConvertToOutputFormat((string *)&variables,this_00,psVar7,SHELL);
  poVar8 = std::operator<<(poVar8,(string *)&variables);
  poVar8 = std::operator<<(poVar8," -B");
  psVar7 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this_01);
  cmOutputConverter::ConvertToOutputFormat(&ninjaBuildFile,this_00,psVar7,SHELL);
  std::operator<<(poVar8,(string *)&ninjaBuildFile);
  std::__cxx11::string::~string((string *)&ninjaBuildFile);
  std::__cxx11::string::~string((string *)&variables);
  std::__cxx11::string::~string((string *)&verify_cmd);
  pcVar1 = this->RulesFileStream;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&verify_cmd,"RERUN_CMAKE",(allocator<char> *)&local_3f8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ninjaBuildFile,"Re-running CMake...",(allocator<char> *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&verifyForce,"Rule for re-running cmake.",(allocator<char> *)&implicitDeps);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&missingInputs,"",(allocator<char> *)&explicitDeps);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_4a8._M_local_buf,"",(allocator<char> *)&local_388);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"",(allocator<char> *)&local_3a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"",&local_52d);
  std::__cxx11::string::string<std::allocator<char>>((string *)&verifyForceDeps,"",&local_52e);
  WriteRule((ostream *)pcVar1,(string *)&verify_cmd,(string *)&variables,&ninjaBuildFile,
            &verifyForce,(string *)&missingInputs,(string *)&local_4a8,&local_468,&local_488,
            (string *)&verifyForceDeps,true);
  std::__cxx11::string::~string((string *)&verifyForceDeps);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)local_4a8._M_local_buf);
  std::__cxx11::string::~string((string *)&missingInputs);
  std::__cxx11::string::~string((string *)&verifyForce);
  std::__cxx11::string::~string((string *)&ninjaBuildFile);
  std::__cxx11::string::~string((string *)&variables);
  std::__cxx11::string::~string((string *)&verify_cmd);
  implicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  explicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  implicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  implicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  explicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  explicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppcVar2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar10 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppcVar10 != ppcVar2;
      ppcVar10 = ppcVar10 + 1) {
    psVar3 = ((*ppcVar10)->Makefile->ListFiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar7 = ((*ppcVar10)->Makefile->ListFiles).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar3; psVar7 = psVar7 + 1)
    {
      __x = ConvertToNinjaPath(this,psVar7);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&implicitDeps,__x);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&implicitDeps,&this->CMakeCacheFile);
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &variables._M_t._M_impl.super__Rb_tree_header._M_header;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (this->NinjaSupportsConsolePool == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&verify_cmd,"pool",(allocator<char> *)&ninjaBuildFile);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&variables,(key_type *)&verify_cmd);
    std::__cxx11::string::assign((char *)pmVar9);
    std::__cxx11::string::~string((string *)&verify_cmd);
  }
  pcVar4 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
  bVar6 = this->NinjaSupportsManifestRestat;
  if ((bool)bVar6 == true) {
    bVar5 = cmake::DoWriteGlobVerifyTarget(pcVar4);
    if (!bVar5) {
      bVar6 = this->NinjaSupportsManifestRestat;
      goto LAB_001f9c81;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&verify_cmd);
    psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmOutputConverter::ConvertToOutputFormat(&ninjaBuildFile,this_00,psVar7,SHELL);
    poVar8 = std::operator<<((ostream *)&verify_cmd,(string *)&ninjaBuildFile);
    poVar8 = std::operator<<(poVar8," -P ");
    psVar7 = cmake::GetGlobVerifyScript_abi_cxx11_(pcVar4);
    cmOutputConverter::ConvertToOutputFormat(&verifyForce,this_00,psVar7,SHELL);
    std::operator<<(poVar8,(string *)&verifyForce);
    std::__cxx11::string::~string((string *)&verifyForce);
    std::__cxx11::string::~string((string *)&ninjaBuildFile);
    pcVar1 = this->RulesFileStream;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ninjaBuildFile,"VERIFY_GLOBS",(allocator<char> *)&local_388);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&missingInputs,"Re-checking globbed directories...",
               (allocator<char> *)&local_3a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_4a8._M_local_buf,"Rule for re-checking globbed directories.",
               &local_52d);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"",&local_52e);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"",&local_52c);
    std::__cxx11::string::string<std::allocator<char>>((string *)&verifyForceDeps,"",&local_529);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"",&local_52a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"",&local_52b);
    WriteRule((ostream *)pcVar1,&ninjaBuildFile,&verifyForce,(string *)&missingInputs,
              (string *)&local_4a8,&local_468,&local_488,(string *)&verifyForceDeps,&local_3f8,
              &local_348,true);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&verifyForceDeps);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)local_4a8._M_local_buf);
    std::__cxx11::string::~string((string *)&missingInputs);
    std::__cxx11::string::~string((string *)&verifyForce);
    std::__cxx11::string::~string((string *)&ninjaBuildFile);
    psVar7 = cmake::GetGlobVerifyScript_abi_cxx11_(pcVar4);
    std::operator+(&verifyForce,psVar7,"_force");
    NinjaOutputPath(&ninjaBuildFile,this,&verifyForce);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&verifyForceDeps,1,&ninjaBuildFile,(allocator_type *)&missingInputs);
    std::__cxx11::string::~string((string *)&ninjaBuildFile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&missingInputs,"Phony target to force glob verification run.",
               (allocator<char> *)&local_3f8);
    local_498 = 0;
    local_468.field_2._M_allocated_capacity = 0;
    local_4a8._M_allocated_capacity = 0;
    local_4a8._8_8_ = 0;
    local_488.field_2._M_allocated_capacity = 0;
    local_468._M_dataplus._M_p = (pointer)0x0;
    local_468._M_string_length = 0;
    local_488._M_dataplus._M_p = (pointer)0x0;
    local_488._M_string_length = 0;
    ninjaBuildFile.field_2._8_8_ = &ninjaBuildFile._M_string_length;
    ninjaBuildFile._M_dataplus._M_p = (pointer)0x0;
    ninjaBuildFile._M_string_length = 0;
    ninjaBuildFile.field_2._M_allocated_capacity = 0;
    WritePhonyBuild(this,local_440,(string *)&missingInputs,&verifyForceDeps,
                    (cmNinjaDeps *)&local_4a8,(cmNinjaDeps *)&local_468,(cmNinjaDeps *)&local_488,
                    (cmNinjaVars *)&ninjaBuildFile);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&ninjaBuildFile);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_488);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_468);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_4a8);
    std::__cxx11::string::~string((string *)&missingInputs);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ninjaBuildFile,"restat",(allocator<char> *)&missingInputs);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&variables,&ninjaBuildFile);
    std::__cxx11::string::assign((char *)pmVar9);
    std::__cxx11::string::~string((string *)&ninjaBuildFile);
    psVar7 = cmake::GetGlobVerifyScript_abi_cxx11_(pcVar4);
    NinjaOutputPath(&ninjaBuildFile,this,psVar7);
    psVar7 = cmake::GetGlobVerifyStamp_abi_cxx11_(pcVar4);
    NinjaOutputPath((string *)&missingInputs,this,psVar7);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_4a8._M_local_buf,
               "Re-run CMake to check if globbed directories changed.",&local_52d);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_468,"VERIFY_GLOBS",&local_52e);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_3f8,1,(value_type *)&missingInputs,(allocator_type *)&local_52c);
    local_348.field_2._M_allocated_capacity = 0;
    local_388.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_348._M_dataplus._M_p = (pointer)0x0;
    local_348._M_string_length = 0;
    local_3a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_388.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_388.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
    local_488._M_string_length = 0;
    local_488.field_2._M_allocated_capacity =
         local_488.field_2._M_allocated_capacity & 0xffffffffffffff00;
    WriteBuild(this,local_440,(string *)&local_4a8,&local_468,(cmNinjaDeps *)&local_3f8,
               (cmNinjaDeps *)&local_348,&local_388,&verifyForceDeps,&local_3a8,&variables,
               &local_488,0,(bool *)0x0);
    std::__cxx11::string::~string((string *)&local_488);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_388);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_348);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)local_4a8._M_local_buf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_4a8._M_local_buf,"restat",(allocator<char> *)&local_468);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::erase(&variables._M_t,(key_type *)&local_4a8);
    std::__cxx11::string::~string((string *)local_4a8._M_local_buf);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&implicitDeps,&ninjaBuildFile);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&explicitDeps,(value_type *)&missingInputs);
    std::__cxx11::string::~string((string *)&missingInputs);
    std::__cxx11::string::~string((string *)&ninjaBuildFile);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&verifyForceDeps);
    psVar7 = &verifyForce;
  }
  else {
LAB_001f9c81:
    if (((bVar6 & 1) != 0) || (bVar5 = cmake::DoWriteGlobVerifyTarget(pcVar4), !bVar5))
    goto LAB_001f9d9d;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&verify_cmd);
    poVar8 = std::operator<<((ostream *)&verify_cmd,"The detected version of Ninja:\n");
    poVar8 = std::operator<<(poVar8,"  ");
    poVar8 = std::operator<<(poVar8,(string *)&this->NinjaVersion);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,
                             "is less than the version of Ninja required by CMake for adding restat dependencies to the build.ninja manifest regeneration target:\n"
                            );
    poVar8 = std::operator<<(poVar8,"  ");
    RequiredNinjaVersionForManifestRestat_abi_cxx11_();
    poVar8 = std::operator<<(poVar8,(string *)&ninjaBuildFile);
    std::operator<<(poVar8,"\n");
    std::__cxx11::string::~string((string *)&ninjaBuildFile);
    std::operator<<((ostream *)&verify_cmd,
                    "Any pre-check scripts, such as those generated for file(GLOB CONFIGURE_DEPENDS), will not be run by Ninja."
                   );
    pcVar4 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
    std::__cxx11::stringbuf::str();
    verifyForce._M_dataplus._M_p = (pointer)0x0;
    verifyForce._M_string_length = 0;
    cmake::IssueMessage(pcVar4,AUTHOR_WARNING,&ninjaBuildFile,(cmListFileBacktrace *)&verifyForce);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&verifyForce._M_string_length);
    psVar7 = &ninjaBuildFile;
  }
  std::__cxx11::string::~string((string *)psVar7);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&verify_cmd);
LAB_001f9d9d:
  std::
  __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (implicitDeps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             implicitDeps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (implicitDeps.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       implicitDeps.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&implicitDeps,(const_iterator)__first._M_current,
          (const_iterator)
          implicitDeps.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&verify_cmd,NINJA_BUILD_FILE,(allocator<char> *)&verifyForce);
  NinjaOutputPath(&ninjaBuildFile,this,(string *)&verify_cmd);
  std::__cxx11::string::~string((string *)&verify_cmd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&verify_cmd,"Re-run CMake if any of its inputs changed.",
             (allocator<char> *)&verifyForceDeps);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&verifyForce,"RERUN_CMAKE",(allocator<char> *)&local_3f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_4a8,1,&ninjaBuildFile,(allocator_type *)&local_348);
  local_468.field_2._M_allocated_capacity = 0;
  local_488.field_2._M_allocated_capacity = 0;
  local_468._M_dataplus._M_p = (pointer)0x0;
  local_468._M_string_length = 0;
  local_488._M_dataplus._M_p = (pointer)0x0;
  local_488._M_string_length = 0;
  missingInputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&missingInputs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  missingInputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  missingInputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)missingInputs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
  WriteBuild(this,local_440,(string *)&verify_cmd,&verifyForce,(cmNinjaDeps *)&local_4a8,
             (cmNinjaDeps *)&local_468,&explicitDeps,&implicitDeps,(cmNinjaDeps *)&local_488,
             &variables,(string *)&missingInputs,0,(bool *)0x0);
  std::__cxx11::string::~string((string *)&missingInputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_488);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_468);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_4a8);
  std::__cxx11::string::~string((string *)&verifyForce);
  std::__cxx11::string::~string((string *)&verify_cmd);
  missingInputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  missingInputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  missingInputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  __set_difference<std::move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::_Rb_tree_const_iterator<std::__cxx11::string>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (implicitDeps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             implicitDeps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             &(this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header,&missingInputs);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&verifyForce,"A missing CMake input file is not an error.",
             (allocator<char> *)&verifyForceDeps);
  local_498 = 0;
  local_468.field_2._M_allocated_capacity = 0;
  local_4a8._M_allocated_capacity = 0;
  local_4a8._8_8_ = 0;
  local_488.field_2._M_allocated_capacity = 0;
  local_468._M_dataplus._M_p = (pointer)0x0;
  local_468._M_string_length = 0;
  local_488._M_dataplus._M_p = (pointer)0x0;
  local_488._M_string_length = 0;
  local_318._8_8_ = &sStack_320;
  _verify_cmd = (pointer)0x0;
  sStack_320 = 0;
  local_318._M_allocated_capacity = 0;
  local_300 = 0;
  local_308 = (size_type *)local_318._8_8_;
  WritePhonyBuild(this,local_440,&verifyForce,&missingInputs,(cmNinjaDeps *)&local_4a8,
                  (cmNinjaDeps *)&local_468,(cmNinjaDeps *)&local_488,(cmNinjaVars *)&verify_cmd);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&verify_cmd);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_488);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_468);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_4a8);
  std::__cxx11::string::~string((string *)&verifyForce);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&missingInputs);
  std::__cxx11::string::~string((string *)&ninjaBuildFile);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&variables._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&explicitDeps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&implicitDeps);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmd);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteTargetRebuildManifest(std::ostream& os)
{
  if (this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION")) {
    return;
  }
  cmLocalGenerator* lg = this->LocalGenerators[0];

  std::ostringstream cmd;
  cmd << lg->ConvertToOutputFormat(cmSystemTools::GetCMakeCommand(),
                                   cmOutputConverter::SHELL)
      << " -S"
      << lg->ConvertToOutputFormat(lg->GetSourceDirectory(),
                                   cmOutputConverter::SHELL)
      << " -B"
      << lg->ConvertToOutputFormat(lg->GetBinaryDirectory(),
                                   cmOutputConverter::SHELL);
  WriteRule(*this->RulesFileStream, "RERUN_CMAKE", cmd.str(),
            "Re-running CMake...", "Rule for re-running cmake.",
            /*depfile=*/"",
            /*deptype=*/"",
            /*rspfile=*/"",
            /*rspcontent*/ "",
            /*restat=*/"",
            /*generator=*/true);

  cmNinjaDeps implicitDeps;
  cmNinjaDeps explicitDeps;
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    std::vector<std::string> const& lf =
      localGen->GetMakefile()->GetListFiles();
    for (std::string const& fi : lf) {
      implicitDeps.push_back(this->ConvertToNinjaPath(fi));
    }
  }
  implicitDeps.push_back(this->CMakeCacheFile);

  cmNinjaVars variables;
  // Use 'console' pool to get non buffered output of the CMake re-run call
  // Available since Ninja 1.5
  if (SupportsConsolePool()) {
    variables["pool"] = "console";
  }

  cmake* cm = this->GetCMakeInstance();
  if (this->SupportsManifestRestat() && cm->DoWriteGlobVerifyTarget()) {
    std::ostringstream verify_cmd;
    verify_cmd << lg->ConvertToOutputFormat(cmSystemTools::GetCMakeCommand(),
                                            cmOutputConverter::SHELL)
               << " -P "
               << lg->ConvertToOutputFormat(cm->GetGlobVerifyScript(),
                                            cmOutputConverter::SHELL);

    WriteRule(*this->RulesFileStream, "VERIFY_GLOBS", verify_cmd.str(),
              "Re-checking globbed directories...",
              "Rule for re-checking globbed directories.",
              /*depfile=*/"",
              /*deptype=*/"",
              /*rspfile=*/"",
              /*rspcontent*/ "",
              /*restat=*/"",
              /*generator=*/true);

    std::string verifyForce = cm->GetGlobVerifyScript() + "_force";
    cmNinjaDeps verifyForceDeps(1, this->NinjaOutputPath(verifyForce));

    this->WritePhonyBuild(os, "Phony target to force glob verification run.",
                          verifyForceDeps, cmNinjaDeps());

    variables["restat"] = "1";
    std::string const verifyScriptFile =
      this->NinjaOutputPath(cm->GetGlobVerifyScript());
    std::string const verifyStampFile =
      this->NinjaOutputPath(cm->GetGlobVerifyStamp());
    this->WriteBuild(os,
                     "Re-run CMake to check if globbed directories changed.",
                     "VERIFY_GLOBS",
                     /*outputs=*/cmNinjaDeps(1, verifyStampFile),
                     /*implicitOuts=*/cmNinjaDeps(),
                     /*explicitDeps=*/cmNinjaDeps(),
                     /*implicitDeps=*/verifyForceDeps,
                     /*orderOnlyDeps=*/cmNinjaDeps(), variables);

    variables.erase("restat");
    implicitDeps.push_back(verifyScriptFile);
    explicitDeps.push_back(verifyStampFile);
  } else if (!this->SupportsManifestRestat() &&
             cm->DoWriteGlobVerifyTarget()) {
    std::ostringstream msg;
    msg << "The detected version of Ninja:\n"
        << "  " << this->NinjaVersion << "\n"
        << "is less than the version of Ninja required by CMake for adding "
           "restat dependencies to the build.ninja manifest regeneration "
           "target:\n"
        << "  "
        << cmGlobalNinjaGenerator::RequiredNinjaVersionForManifestRestat()
        << "\n";
    msg << "Any pre-check scripts, such as those generated for file(GLOB "
           "CONFIGURE_DEPENDS), will not be run by Ninja.";
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           msg.str());
  }

  std::sort(implicitDeps.begin(), implicitDeps.end());
  implicitDeps.erase(std::unique(implicitDeps.begin(), implicitDeps.end()),
                     implicitDeps.end());

  std::string const ninjaBuildFile = this->NinjaOutputPath(NINJA_BUILD_FILE);
  this->WriteBuild(os, "Re-run CMake if any of its inputs changed.",
                   "RERUN_CMAKE",
                   /*outputs=*/cmNinjaDeps(1, ninjaBuildFile),
                   /*implicitOuts=*/cmNinjaDeps(), explicitDeps, implicitDeps,
                   /*orderOnlyDeps=*/cmNinjaDeps(), variables);

  cmNinjaDeps missingInputs;
  std::set_difference(std::make_move_iterator(implicitDeps.begin()),
                      std::make_move_iterator(implicitDeps.end()),
                      CustomCommandOutputs.begin(), CustomCommandOutputs.end(),
                      std::back_inserter(missingInputs));

  this->WritePhonyBuild(os, "A missing CMake input file is not an error.",
                        missingInputs, cmNinjaDeps());
}